

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.cc
# Opt level: O3

VectorXd solveStep(shared_ptr<const_lf::mesh::Mesh> *mesh,DofHandler *dofh,double flowrate,
                  bool modified_penalty)

{
  bool in_CL;
  undefined7 in_register_00000011;
  DofHandler *dofh_00;
  Index extraout_RDX;
  VectorXd VVar1;
  SparseMatrix<double,_0,_int> As;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  VtkWriter writer;
  scalar_sum_op<double,_double> local_549;
  _Any_data local_548;
  code *local_538;
  code *local_530;
  void *local_528;
  CompressedStorage<double,_int> local_520;
  shared_ptr<const_lf::mesh::Mesh> local_500;
  string local_4f0;
  undefined1 local_4d0 [16];
  double *local_4c0;
  COOMatrix<double> local_4b0;
  double local_490;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_488;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_460;
  undefined1 local_450 [16];
  _Alloc_hider local_440;
  pointer local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [34];
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  
  dofh_00 = (DofHandler *)CONCAT71(in_register_00000011,modified_penalty);
  local_548._M_unused._M_object = &local_490;
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  local_1f0 = std::
              _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/step/step.cc:73:12)>
              ::_M_invoke;
  local_1f8 = std::
              _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/step/step.cc:73:12)>
              ::_M_manager;
  local_548._8_8_ = 0;
  local_530 = std::
              _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/step/step.cc:78:26)>
              ::_M_invoke;
  local_538 = std::
              _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/step/step.cc:78:26)>
              ::_M_manager;
  local_490 = flowrate;
  lf::quad::make_TriaQR_MidpointRule();
  projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow
            ((tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_4d0,(shared_ptr<const_lf::mesh::Mesh> *)dofh,dofh_00,
             (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
              *)&local_208,
             (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *)&local_548
             ,1.0,(QuadRule *)local_450,in_CL);
  free((void *)local_430[0]._0_8_);
  free((void *)local_450._8_8_);
  if (local_538 != (code *)0x0) {
    (*local_538)(&local_548,&local_548,3);
  }
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,3);
  }
  local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dofh->_vptr_DofHandler;
  local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dofh[1]._vptr_DofHandler;
  if (local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"offset_function.vtk","");
  lf::io::VtkWriter::VtkWriter((VtkWriter *)&local_208,&local_500,&local_4f0,0,'\x01');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if (local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_500.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_548._M_unused._M_object = &local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"v","");
  projects::ipdg_stokes::post_processing::extractVelocity
            ((CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_450,
             (shared_ptr<const_lf::mesh::Mesh> *)dofh,dofh_00,(VectorXd *)local_4d0);
  local_488.m_lhs.m_dec =
       (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)0x0;
  local_488.m_lhs.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  lf::io::VtkWriter::WriteCellData
            ((VtkWriter *)&local_208,(string *)&local_548,
             (MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_450,(Vector2d *)&local_488)
  ;
  local_450._0_8_ = &PTR_operator___004cfee0;
  if (local_430[0]._8_8_ != 0) {
    operator_delete(local_438,local_430[0]._8_8_ << 4);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p);
  }
  if ((code **)local_548._M_unused._0_8_ != &local_538) {
    operator_delete(local_548._M_unused._M_object,(ulong)(local_538 + 1));
  }
  local_548._M_unused._M_object = &local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"c","");
  projects::ipdg_stokes::post_processing::extractBasisFunctionCoefficients
            ((CodimMeshDataSet<double> *)local_450,(shared_ptr<const_lf::mesh::Mesh> *)dofh,dofh_00,
             (VectorXd *)local_4d0);
  lf::io::VtkWriter::WritePointData
            ((VtkWriter *)&local_208,(string *)&local_548,(MeshDataSet<double> *)local_450,0.0);
  local_450._0_8_ = &PTR_operator___004cff38;
  if (local_430[0]._8_8_ != 0) {
    operator_delete(local_438,local_430[0]._8_8_ << 3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_440._M_p);
  }
  if ((code **)local_548._M_unused._0_8_ != &local_538) {
    operator_delete(local_548._M_unused._M_object,(ulong)(local_538 + 1));
  }
  lf::assemble::COOMatrix<double>::makeSparse((SparseMatrix<double,_0,_int> *)&local_548,&local_4b0)
  ;
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_450
            );
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::analyzePattern
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_450
             ,(MatrixType *)&local_548);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_450
             ,(MatrixType *)&local_548);
  local_460 = Eigen::
              SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
              ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                          *)local_450,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4c0);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseBinaryOp(&local_488,&local_460,(Rhs *)local_4d0,&local_549);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)mesh,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_488);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_450
            );
  free(local_530);
  free(local_528);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_520);
  lf::io::VtkWriter::~VtkWriter((VtkWriter *)&local_208);
  if (local_4b0.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4b0.triplets_.
                    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_4b0.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4b0.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  free(local_4c0);
  free((void *)local_4d0._0_8_);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)mesh;
  return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd solveStep(const std::shared_ptr<const lf::mesh::Mesh> &mesh,
                          const lf::assemble::DofHandler &dofh, double flowrate,
                          bool modified_penalty) {
  // No volume forces are present
  auto f = [](const Eigen::Vector2d & /*unused*/) -> Eigen::Vector2d {
    return Eigen::Vector2d::Zero();
  };
  // Enforce a Poiseuille in- and outflow and no-slip boundary conditions at the
  // tube boundaries
  auto dirichlet_funct = [&](const lf::mesh::Entity &edge) -> Eigen::Vector2d {
    static constexpr double eps = 1e-10;
    const auto *const geom = edge.Geometry();
    const auto vertices = geom->Global(edge.RefEl().NodeCoords());
    const Eigen::Vector2d midpoint = vertices.rowwise().sum() / 2;
    Eigen::Vector2d v;
    if (vertices(0, 0) >= -3 - eps && vertices(0, 0) <= -3 + eps &&
        vertices(0, 1) >= -3 - eps && vertices(0, 1) <= -3 + eps) {
      // The edge is part of the inflow boundary
      v << poiseuilleVelocity(0.5, flowrate, midpoint[1] - 0.5), 0;
      return v;
    }
    if (vertices(0, 0) >= 3 - eps && vertices(0, 0) <= 3 + eps &&
        vertices(0, 1) >= 3 - eps && vertices(0, 1) <= 3 + eps) {
      // The edge is part of the outflow boundary
      v << poiseuilleVelocity(1, flowrate, midpoint[1]), 0;
      return v;
    }
    return Eigen::Vector2d::Zero();
  };

  // Solve the system using sparse LU
  const auto [A, rhs, offset_function] =
      projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(
          mesh, dofh, f, dirichlet_funct, 1,
          lf::quad::make_TriaQR_MidpointRule(), modified_penalty);
  lf::io::VtkWriter writer(mesh, "offset_function.vtk");
  writer.WriteCellData("v",
                       projects::ipdg_stokes::post_processing::extractVelocity(
                           mesh, dofh, offset_function));
  writer.WritePointData(
      "c",
      projects::ipdg_stokes::post_processing::extractBasisFunctionCoefficients(
          mesh, dofh, offset_function));
  auto As = A.makeSparse();
  Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
  solver.compute(As);
  return solver.solve(rhs) + offset_function;
}